

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall
sptk::reaper::EpochTracker::GetLpcResidual
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  size_type sVar6;
  ulong uVar7;
  reference pvVar8;
  const_reference pvVar9;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar10;
  int32_t k;
  int32_t mem;
  float sum;
  int32_t sample;
  float delta_gain;
  int32_t proc_p;
  int32_t output_p;
  int32_t input_p;
  int32_t n_to_filter;
  float new_gain;
  float old_gain;
  int32_t i;
  float preemp_rms;
  float norm_error;
  float *delta_lpc;
  float *old_lpc;
  float *lpc;
  int32_t order;
  LpcAnalyzer lp;
  int32_t n_analyzed;
  int32_t n_frames;
  int32_t frame_size;
  int32_t frame_step;
  int32_t n_input;
  float in_stack_0000036c;
  float *in_stack_00000370;
  float *in_stack_00000378;
  float *in_stack_00000380;
  int in_stack_0000038c;
  float in_stack_00000390;
  int in_stack_00000394;
  LpcAnalyzer *in_stack_00000398;
  float *in_stack_000003b0;
  float *in_stack_000003b8;
  float *in_stack_000003c0;
  LpcAnalyzer *in_stack_fffffffffffffe60;
  LpcAnalyzer *this_00;
  size_type in_stack_fffffffffffffe78;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe80;
  int local_dc;
  int local_d8;
  float local_d4;
  int local_d0;
  int local_c8;
  int local_c4;
  int local_bc;
  float local_b4;
  int local_b0;
  LpcAnalyzer local_a4;
  int local_74;
  int local_3c;
  int local_38;
  int32_t local_34;
  int local_30;
  int local_2c;
  vector<float,_std::allocator<float>_> *local_28;
  float local_1c;
  vector<float,_std::allocator<float>_> *local_18;
  byte local_1;
  
  local_28 = in_RDX;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  sVar6 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  local_2c = (int)sVar6;
  if (((local_2c < 1) || (local_1c <= 0.0)) ||
     (local_28 == (vector<float,_std::allocator<float>_> *)0x0)) {
    local_1 = 0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_30 = RoundUp(local_1c * *(float *)(in_RDI + 0x184));
    local_34 = RoundUp(local_1c * *(float *)(in_RDI + 0x180));
    iVar5 = (local_2c - local_34) / local_30;
    local_3c = iVar5 * local_30 + local_34;
    local_38 = iVar5 + 1;
    if ((local_2c < local_3c) || (local_38 = iVar5, 0 < iVar5)) {
      LpcAnalyzer::LpcAnalyzer(in_stack_fffffffffffffe60);
      local_74 = LpcAnalyzer::GetLpcOrder(local_1c);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(local_74 + 1);
      uVar7 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      local_a4._20_8_ = operator_new__(uVar7);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(local_74 + 1);
      uVar7 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._12_8_ = operator_new__(uVar7);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)(local_74 + 1);
      uVar7 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._4_8_ = operator_new__(uVar7);
      local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<float,_std::allocator<float>_>::front(&in_stack_fffffffffffffe60->energywind_);
      this_00 = &local_a4;
      iVar5 = LpcAnalyzer::ComputeLpc
                        (in_stack_00000398,in_stack_00000394,in_stack_00000390,in_stack_0000038c,
                         in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_000003b0,
                         in_stack_000003b8,in_stack_000003c0,in_stack_0000036c);
      if (iVar5 == 0) {
        if ((float *)local_a4._20_8_ != (float *)0x0) {
          operator_delete__((void *)local_a4._20_8_);
        }
        if ((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._12_8_ != (float *)0x0) {
          operator_delete__((void *)local_a4.energywind_.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._12_8_);
        }
        if ((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._4_8_ != (float *)0x0) {
          operator_delete__((void *)local_a4.energywind_.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._4_8_);
        }
        local_1 = 0;
      }
      else {
        for (local_b0 = 0; local_b0 <= local_74; local_b0 = local_b0 + 1) {
          *(float *)(local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._4_8_ + (long)local_b0 * 4) = 0.0;
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](local_28,(long)local_b0);
          *pvVar8 = 0.0;
        }
        local_b4 = LpcDcGain((float *)local_a4.energywind_.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._12_8_,local_74);
        local_bc = local_34 / 2 - local_74;
        local_c4 = local_74;
        local_c8 = 0;
        for (; 0 < local_38; local_38 = local_38 + -1) {
          std::vector<float,_std::allocator<float>_>::front(&this_00->energywind_);
          this_00 = &local_a4;
          iVar5 = LpcAnalyzer::ComputeLpc
                            (in_stack_00000398,in_stack_00000394,in_stack_00000390,in_stack_0000038c
                             ,in_stack_00000380,in_stack_00000378,in_stack_00000370,
                             in_stack_000003b0,in_stack_000003b8,in_stack_000003c0,in_stack_0000036c
                            );
          if (iVar5 == 0) {
            if ((float *)local_a4._20_8_ != (float *)0x0) {
              operator_delete__((void *)local_a4._20_8_);
            }
            if ((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._12_8_ != (float *)0x0) {
              operator_delete__((void *)local_a4.energywind_.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._12_8_);
            }
            if ((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._4_8_ != (float *)0x0) {
              operator_delete__((void *)local_a4.energywind_.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._4_8_);
            }
            local_1 = 0;
            goto LAB_00120105;
          }
          fVar10 = LpcDcGain((float *)local_a4._20_8_,local_74);
          fVar10 = fVar10 - local_b4;
          MakeDeltas((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._12_8_,(float *)local_a4._20_8_,
                     local_74 + 1,local_bc,
                     (float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._4_8_);
          for (local_d0 = 0; local_d0 < local_bc; local_d0 = local_d0 + 1) {
            local_d4 = 0.0;
            local_d8 = local_c8;
            for (local_dc = local_74; 0 < local_dc; local_dc = local_dc + -1) {
              fVar1 = *(float *)(local_a4.energywind_.
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._12_8_ + (long)local_dc * 4);
              pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                                 (local_18,(long)local_d8);
              local_d4 = fVar1 * *pvVar9 + local_d4;
              *(float *)(local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._12_8_ + (long)local_dc * 4) =
                   *(float *)(local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._4_8_ + (long)local_dc * 4) +
                   *(float *)(local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._12_8_ + (long)local_dc * 4);
              local_d8 = local_d8 + 1;
            }
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](local_18,(long)local_d8)
            ;
            fVar1 = *pvVar9;
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](local_28,(long)local_c4)
            ;
            *pvVar8 = (fVar1 + local_d4) / local_b4;
            local_b4 = fVar10 / (float)local_bc + local_b4;
            local_c8 = local_c8 + 1;
            local_c4 = local_c4 + 1;
          }
          local_bc = local_30;
        }
        if ((float *)local_a4._20_8_ != (float *)0x0) {
          operator_delete__((void *)local_a4._20_8_);
        }
        if ((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._12_8_ != (float *)0x0) {
          operator_delete__((void *)local_a4.energywind_.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._12_8_);
        }
        if ((float *)local_a4.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._4_8_ != (float *)0x0) {
          operator_delete__((void *)local_a4.energywind_.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._4_8_);
        }
        local_1 = 1;
      }
LAB_00120105:
      LpcAnalyzer::~LpcAnalyzer(this_00);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool EpochTracker::GetLpcResidual(const std::vector<float>& input, float sample_rate,
                                  std::vector<float>* output) {
  int32_t n_input = input.size();
  if (!((n_input > 0) && (sample_rate > 0.0) && output)) {
    return false;
  }
  output->resize(n_input);
  int32_t frame_step = RoundUp(sample_rate * lpc_frame_interval_);
  int32_t frame_size = RoundUp(sample_rate * frame_duration_);
  int32_t n_frames = 1 + ((n_input - frame_size) / frame_step);
  int32_t n_analyzed = ((n_frames - 1) * frame_step) + frame_size;
  // Must have one more than frame size to do a complete frame.
  if (n_analyzed <= n_input) {
    n_frames--;
    if (n_frames <= 0) {
      return false;
    }
  }
  LpcAnalyzer lp;
  int32_t order = lp.GetLpcOrder(sample_rate);
  float* lpc = new float[order + 1];
  float* old_lpc = new float[order + 1];
  float* delta_lpc = new float[order + 1];
  float norm_error = 0.0;
  float preemp_rms = 0.0;

#define  RELEASE_MEMORY() {                     \
    delete [] lpc;                              \
    delete [] old_lpc;                          \
    delete [] delta_lpc;                        \
  }

  if (!lp.ComputeLpc(order, noise_floor_, frame_size, &(input.front()),
                     old_lpc, NULL, NULL, &norm_error, &preemp_rms,
                     preemphasis_)) {
    RELEASE_MEMORY();
    return false;
  }
  for (int32_t i = 0; i <= order; ++i) {
    delta_lpc[i] = 0.0;
    (*output)[i] = 0.0;
  }
  float old_gain = LpcDcGain(old_lpc, order);
  float new_gain = 1.0;
  int32_t n_to_filter = (frame_size / 2) - order;  // How many samples
  // to process before
  // computing the next
  // LPC frame.
  int32_t input_p = 0;  // Where to get the next frame for LPC analysis
  int32_t output_p = order;  // where to store output samples.
  int32_t proc_p = 0;  // Where to pick up samples for input to the filter

  // Main processing loop:
  // Compute a new frame of LPC
  // Compute the DC gain for the new LPC
  // Compute delta DC gain.
  // Compute the LPC deltas.
  // For each point in the frame:
  //   Use old_lpc to produce an output point.
  //   Update the old LPCs and the DC gain
  // As soon as the center of the current frame is reached, compute
  // the LPC for the next frame.
  for ( ; n_frames > 0; --n_frames, input_p += frame_step,
            n_to_filter = frame_step) {
    if (!lp.ComputeLpc(order, noise_floor_, frame_size,
                       (&(input.front())) + input_p, lpc, NULL, NULL,
                       &norm_error, &preemp_rms, preemphasis_)) {
      RELEASE_MEMORY();
      return false;
    }
    new_gain = LpcDcGain(lpc, order);
    float delta_gain = (new_gain - old_gain) / n_to_filter;
    MakeDeltas(old_lpc, lpc, order+1, n_to_filter, delta_lpc);
    for (int32_t sample = 0; sample < n_to_filter; ++sample, ++proc_p,
             ++output_p) {
      float sum = 0.0;
      int32_t mem = proc_p;
      for (int32_t k = order; k > 0; --k, ++mem) {
        sum += (old_lpc[k] * input[mem]);
        old_lpc[k] += delta_lpc[k];
      }
      sum += input[mem];  // lpc[0] is always 1.0
      (*output)[output_p] = sum / old_gain;
      old_gain += delta_gain;
    }
  }
  RELEASE_MEMORY();
  return true;
}